

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laplace_pyramid.h
# Opt level: O1

void gimage::createLaplacianPyramid<unsigned_char>
               (vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                *p,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pIVar7;
  int j;
  int iVar8;
  float *pfVar9;
  long i;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  double dVar16;
  
  lVar4 = image->width;
  if (image->height < image->width) {
    lVar4 = image->height;
  }
  iVar8 = 0;
  if (1 < (int)lVar4) {
    dVar16 = log((double)(int)lVar4);
    dVar16 = floor(dVar16 / 0.6931471805599453);
    iVar8 = (int)dVar16;
  }
  std::
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  ::resize(p,(long)iVar8);
  if ((iVar8 != 0) &&
     (Image<float,_gimage::PixelTraits<float>_>::setImage<unsigned_char>
                ((p->
                 super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,image), 1 < iVar8)) {
    uVar5 = 0;
    do {
      pIVar7 = (p->
               super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar5 + 1;
      reduceGauss<float,float>(pIVar7 + uVar5 + 1,pIVar7 + uVar5);
      pIVar7 = (p->
               super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0 < pIVar7[uVar5].depth) {
        lVar2 = pIVar7[uVar5].width;
        lVar3 = pIVar7[uVar5].height;
        lVar4 = lVar3 + -2;
        lVar11 = 0;
        if (0 < lVar4) {
          lVar11 = lVar4;
        }
        lVar13 = 0;
        do {
          pfVar9 = *pIVar7[uVar5].img[lVar13];
          j = (int)lVar13;
          if (0 < lVar3) {
            lVar12 = 0;
            do {
              if (0 < lVar2) {
                lVar14 = 0;
                lVar10 = 0;
                do {
                  fVar15 = expandGaussPixel<float>
                                     ((p->
                                      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar6,lVar10,
                                      lVar12,j);
                  pfVar9[lVar10] = pfVar9[lVar10] - fVar15;
                  lVar10 = lVar10 + 1;
                  lVar14 = lVar14 + -4;
                } while (lVar2 != lVar10);
                pfVar9 = (float *)((long)pfVar9 - lVar14);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 != (ulong)(lVar3 != 1) + 1);
          }
          if (4 < lVar3) {
            lVar12 = 2;
            do {
              if (0 < lVar2) {
                fVar15 = expandGaussPixel<float>
                                   ((p->
                                    super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar6,0,lVar12,j);
                *pfVar9 = *pfVar9 - fVar15;
                pfVar9 = pfVar9 + 1;
              }
              if (1 < lVar2) {
                fVar15 = expandGaussPixel<float>
                                   ((p->
                                    super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar6,1,lVar12,j);
                *pfVar9 = *pfVar9 - fVar15;
                pfVar9 = pfVar9 + 1;
              }
              if (4 < lVar2) {
                lVar10 = 2;
                lVar14 = 0;
                do {
                  fVar15 = expandGaussPixelInner<float>
                                     ((p->
                                      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar6,lVar10,
                                      lVar12,j);
                  pfVar9[lVar10 + -2] = pfVar9[lVar10 + -2] - fVar15;
                  lVar1 = (4 - lVar2) + lVar10;
                  lVar10 = lVar10 + 1;
                  lVar14 = lVar14 + -4;
                } while (lVar1 != 1);
                pfVar9 = (float *)((long)pfVar9 - lVar14);
              }
              if (2 < lVar2) {
                fVar15 = expandGaussPixel<float>
                                   ((p->
                                    super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar6,lVar2 + -2,
                                    lVar12,j);
                *pfVar9 = *pfVar9 - fVar15;
                pfVar9 = pfVar9 + 1;
              }
              if (3 < lVar2) {
                fVar15 = expandGaussPixel<float>
                                   ((p->
                                    super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar6,lVar2 + -1,
                                    lVar12,j);
                *pfVar9 = *pfVar9 - fVar15;
                pfVar9 = pfVar9 + 1;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 != lVar4);
          }
          lVar12 = lVar11;
          if (0 < lVar3) {
            do {
              if (0 < lVar2) {
                lVar14 = 0;
                lVar10 = 0;
                do {
                  fVar15 = expandGaussPixel<float>
                                     ((p->
                                      super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar6,lVar10,
                                      lVar12,j);
                  pfVar9[lVar10] = pfVar9[lVar10] - fVar15;
                  lVar10 = lVar10 + 1;
                  lVar14 = lVar14 + -4;
                } while (lVar2 != lVar10);
                pfVar9 = (float *)((long)pfVar9 - lVar14);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < lVar3);
          }
          lVar13 = lVar13 + 1;
          pIVar7 = (p->
                   super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (lVar13 < pIVar7[uVar5].depth);
      }
      uVar5 = uVar6;
    } while (uVar6 != iVar8 - 1);
  }
  return;
}

Assistant:

void createLaplacianPyramid(std::vector<ImageFloat> &p,
  const Image<T> &image)
{
  // determine number of levels

  int n=std::min(image.getWidth(), image.getHeight());

  if (n >= 2)
  {
    n=static_cast<int>(std::floor(std::log(n)/std::log(2)));
  }
  else
  {
    n=0;
  }

  p.resize(n);

  if (n == 0) return; // input image is too small

  // populate highest level with given image

  p[0].setImage(image);

  // for all other levels

  for (int l=0; l<n-1; l++)
  {
    // compute downscaled Gaussian image for next level

    reduceGauss(p[l+1], p[l]);

    // compute Laplacian as difference of Gaussian

    const long w=p[l].getWidth();
    const long h=p[l].getHeight();

    // for all color channels

    for (int d=0; d<p[l].getDepth(); d++)
    {
      float *px=p[l].getPtr(0, 0, d);
      for (long k=0; k<2 && k<h; k++)
      {
        for (long i=0; i<w; i++)
        {
          *px++-=expandGaussPixel(p[l+1], i, k, d);
        }
      }

      for (long k=2; k<h-2; k++)
      {
        if (w > 0) *px++-=expandGaussPixel(p[l+1], 0, k, d);
        if (w > 1) *px++-=expandGaussPixel(p[l+1], 1, k, d);

        for (long i=2; i<w-2; i++)
        {
          *px++-=expandGaussPixelInner(p[l+1], i, k, d);
        }

        if (w > 2) *px++-=expandGaussPixel(p[l+1], w-2, k, d);
        if (w > 3) *px++-=expandGaussPixel(p[l+1], w-1, k, d);
      }

      for (long k=std::max(0l, h-2); k<h; k++)
      {
        for (long i=0; i<w; i++)
        {
          *px++-=expandGaussPixel(p[l+1], i, k, d);
        }
      }
    }
  }
}